

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O3

int main(void)

{
  GLFWcursor *cursorHandle;
  double dVar1;
  GLsizei GVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLFWcursor *pGVar7;
  GLFWwindow *handle;
  long lVar8;
  int iVar9;
  long lVar10;
  GLFWcursor **ppGVar11;
  char cVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  int fb_height;
  int fb_width;
  int wnd_width;
  int wnd_height;
  GLuint vertex_buffer;
  GLFWcursor *star_cursors [60];
  uchar buffer [4096];
  GLsizei local_4280;
  GLsizei local_427c;
  double local_4278;
  GLint local_4270;
  int local_426c;
  undefined1 local_4268 [8];
  undefined8 local_4260;
  float local_4258;
  undefined4 local_4254;
  undefined8 local_4250;
  undefined1 local_4248 [16];
  undefined1 local_4238 [16];
  int local_4220;
  GLuint local_421c;
  GLFWimage local_4218 [30];
  undefined4 local_4038;
  undefined8 local_4034;
  undefined8 uStack_402c;
  float local_4024;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined4 local_4010;
  undefined4 uStack_400c;
  undefined4 uStack_4008;
  undefined4 uStack_4004;
  undefined8 local_4000;
  
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    local_4218[0].width = 0x20;
    local_4218[0].height = 0x20;
    local_4218[0].pixels = (uchar *)&local_4038;
    iVar3 = 0;
    lVar8 = 0;
    do {
      lVar8 = (long)(int)lVar8;
      iVar9 = 0x20;
      do {
        cVar12 = -(iVar9 == 0x19 || iVar3 == 7);
        *(char *)((long)&local_4038 + lVar8) = cVar12;
        *(undefined2 *)((long)&local_4038 + lVar8 + 1) = 0;
        *(char *)((long)&local_4038 + lVar8 + 3) = cVar12;
        lVar8 = lVar8 + 4;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x20);
    tracking_cursor = glfwCreateCursor(local_4218,7,7);
    if (tracking_cursor != (GLFWcursor *)0x0) {
      lVar8 = 0;
      do {
        local_4268._0_4_ = 0x40;
        local_4268._4_4_ = 0x40;
        local_4260 = (uchar *)&local_4038;
        local_4278 = (double)((float)(int)lVar8 / 60.0) * 6.283185307179586;
        iVar3 = 0;
        lVar14 = 0;
        do {
          fVar15 = (float)iVar3 + -32.0;
          local_4238 = ZEXT416((uint)(fVar15 * fVar15));
          local_4248 = ZEXT416((uint)ABS(fVar15));
          lVar13 = (long)(int)lVar14;
          lVar14 = -lVar13;
          lVar10 = 0;
          do {
            *(undefined2 *)((long)&local_4038 + lVar10 * 4 + lVar13) = 0xffff;
            *(undefined1 *)((long)&local_4038 + lVar10 * 4 + lVar13 + 2) = 0xff;
            dVar1 = sin(local_4278);
            fVar15 = (float)dVar1 * 0.25 + 0.75;
            fVar20 = fVar15 * 3.0;
            fVar16 = (float)(int)lVar10 + -32.0;
            fVar19 = 32.0;
            if ((int)lVar10 != 0x20) {
              fVar19 = fVar20 / ABS(fVar16);
            }
            fVar21 = 32.0;
            if (iVar3 != 0x20) {
              fVar21 = fVar20 / (float)local_4248._0_4_;
            }
            fVar16 = SQRT(fVar16 * fVar16 + (float)local_4238._0_4_) * -0.03125 + 1.0;
            dVar1 = (double)(fVar15 * fVar16 * 0.2 + fVar16 * fVar19 * fVar21);
            if (1.0 <= dVar1) {
              dVar1 = 1.0;
            }
            if (dVar1 <= 0.0) {
              dVar1 = 0.0;
            }
            *(char *)((long)&local_4038 + lVar10 * 4 + lVar13 + 3) =
                 (char)(int)((float)dVar1 * 255.0);
            lVar14 = lVar14 + -4;
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 0x40);
          iVar3 = iVar3 + 1;
          lVar14 = -lVar14;
        } while (iVar3 != 0x40);
        pGVar7 = glfwCreateCursor((GLFWimage *)local_4268,0x20,0x20);
        *(GLFWcursor **)(&local_4218[0].width + lVar8 * 2) = pGVar7;
        if (pGVar7 == (GLFWcursor *)0x0) goto LAB_00114c2b;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x3c);
      ppGVar11 = standard_cursors;
      lVar8 = 0;
      do {
        pGVar7 = glfwCreateStandardCursor(*(int *)((long)&DAT_0012e170 + lVar8));
        *ppGVar11 = pGVar7;
        if (pGVar7 == (GLFWcursor *)0x0) goto LAB_00114c2b;
        lVar8 = lVar8 + 4;
        ppGVar11 = ppGVar11 + 1;
      } while (lVar8 != 0x18);
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      handle = glfwCreateWindow(0x280,0x1e0,"Cursor Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        gladLoadGL(glfwGetProcAddress);
        (*glad_glGenBuffers)(1,&local_421c);
        (*glad_glBindBuffer)(0x8892,local_421c);
        GVar4 = (*glad_glCreateShader)(0x8b31);
        (*glad_glShaderSource)(GVar4,1,&vertex_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar4);
        GVar5 = (*glad_glCreateShader)(0x8b30);
        (*glad_glShaderSource)(GVar5,1,&fragment_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar5);
        GVar6 = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(GVar6,GVar4);
        (*glad_glAttachShader)(GVar6,GVar5);
        (*glad_glLinkProgram)(GVar6);
        local_4270 = (*glad_glGetUniformLocation)(GVar6,"MVP");
        GVar4 = (*glad_glGetAttribLocation)(GVar6,"vPos");
        (*glad_glEnableVertexAttribArray)(GVar4);
        (*glad_glVertexAttribPointer)(GVar4,2,0x1406,'\0',8,(void *)0x0);
        (*glad_glUseProgram)(GVar6);
        glfwGetCursorPos(handle,&cursor_x,&cursor_y);
        printf("Cursor position: %f %f\n",SUB84(cursor_x,0),cursor_y);
        glfwSetCursorPosCallback(handle,cursor_position_callback);
        glfwSetKeyCallback(handle,key_callback);
        iVar3 = glfwWindowShouldClose(handle);
        if (iVar3 == 0) {
          pGVar7 = (GLFWcursor *)0x0;
          do {
            (*glad_glClear)(0x4000);
            if (track_cursor != 0) {
              glfwGetWindowSize(handle,&local_426c,&local_4220);
              glfwGetFramebufferSize(handle,&local_427c,&local_4280);
              (*glad_glViewport)(0,0,local_427c,local_4280);
              GVar2 = local_4280;
              local_4238._0_4_ = (float)local_427c;
              local_4248._0_8_ = (double)local_4280;
              local_4268._0_4_ = 0x3f000000;
              local_4278 = (double)((float)local_427c / (float)local_426c);
              dVar1 = floor(cursor_y * local_4278);
              fVar15 = (float)(((double)local_4248._0_8_ - dVar1) + -1.0 + 0.5);
              local_4268._4_4_ = fVar15;
              local_4260 = (uchar *)CONCAT44(fVar15,(float)local_4238._0_4_ + 0.5);
              dVar1 = floor(local_4278 * cursor_x);
              local_4254 = 0x3f000000;
              local_4258 = (float)dVar1 + 0.5;
              local_4250 = CONCAT44((float)GVar2 + 0.5,local_4258);
              (*glad_glBufferData)(0x8892,0x20,local_4268,0x88e0);
              local_4034 = 0;
              uStack_402c = 0;
              local_4038 = (float)local_427c;
              local_4024 = (float)local_4280;
              auVar17._0_8_ = CONCAT44(local_4024,local_4038) ^ 0x8000000080000000;
              auVar17._8_4_ = 0x80000000;
              auVar17._12_4_ = 0x80000000;
              auVar18._4_4_ = local_4024;
              auVar18._0_4_ = local_4038;
              auVar18._8_8_ = 0;
              auVar18 = divps(auVar17,auVar18);
              uStack_4008 = auVar18._0_4_;
              uStack_4004 = auVar18._4_4_;
              local_4010 = 0xc0000000;
              uStack_400c = 0;
              local_4020 = 0;
              uStack_4018 = 0;
              local_4038 = 2.0 / local_4038;
              local_4024 = 2.0 / local_4024;
              local_4000 = 0x3f800000bf800000;
              (*glad_glUniformMatrix4fv)(local_4270,1,'\0',(GLfloat *)&local_4038);
              (*glad_glDrawArrays)(1,0,4);
            }
            glfwSwapBuffers(handle);
            if (animate_cursor == 0) {
              pGVar7 = (GLFWcursor *)0x0;
            }
            else {
              dVar1 = glfwGetTime();
              cursorHandle = *(GLFWcursor **)
                              (&local_4218[0].width + (long)((int)(dVar1 * 30.0) % 0x3c) * 2);
              if (pGVar7 != cursorHandle) {
                glfwSetCursor(handle,cursorHandle);
                pGVar7 = cursorHandle;
              }
            }
            if (wait_events == 0) {
              glfwPollEvents();
            }
            else if (animate_cursor == 0) {
              glfwWaitEvents();
            }
            else {
              glfwWaitEventsTimeout(0.03333333333333333);
            }
            fflush(_stdout);
            iVar3 = glfwWindowShouldClose(handle);
          } while (iVar3 == 0);
        }
        glfwDestroyWindow(handle);
        lVar8 = 0;
        do {
          glfwDestroyCursor(*(GLFWcursor **)(&local_4218[0].width + lVar8 * 2));
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x3c);
        lVar8 = 0;
        do {
          glfwDestroyCursor(*(GLFWcursor **)((long)standard_cursors + lVar8));
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x30);
        glfwTerminate();
        exit(0);
      }
    }
LAB_00114c2b:
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLFWwindow* window;
    GLFWcursor* star_cursors[CURSOR_FRAME_COUNT];
    GLFWcursor* current_frame = NULL;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    tracking_cursor = create_tracking_cursor();
    if (!tracking_cursor)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
    {
        star_cursors[i] = create_cursor_frame(i / (float) CURSOR_FRAME_COUNT);
        if (!star_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
    {
        const int shapes[] = {
            GLFW_ARROW_CURSOR,
            GLFW_IBEAM_CURSOR,
            GLFW_CROSSHAIR_CURSOR,
            GLFW_HAND_CURSOR,
            GLFW_HRESIZE_CURSOR,
            GLFW_VRESIZE_CURSOR
        };

        standard_cursors[i] = glfwCreateStandardCursor(shapes[i]);
        if (!standard_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Cursor Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vec2), (void*) 0);
    glUseProgram(program);

    glfwGetCursorPos(window, &cursor_x, &cursor_y);
    printf("Cursor position: %f %f\n", cursor_x, cursor_y);

    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        if (track_cursor)
        {
            int wnd_width, wnd_height, fb_width, fb_height;
            float scale;
            vec2 vertices[4];
            mat4x4 mvp;

            glfwGetWindowSize(window, &wnd_width, &wnd_height);
            glfwGetFramebufferSize(window, &fb_width, &fb_height);

            glViewport(0, 0, fb_width, fb_height);

            scale = (float) fb_width / (float) wnd_width;
            vertices[0][0] = 0.5f;
            vertices[0][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[1][0] = (float) fb_width + 0.5f;
            vertices[1][1] = (float) (fb_height - floor(cursor_y * scale) - 1.f + 0.5f);
            vertices[2][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[2][1] = 0.5f;
            vertices[3][0] = (float) floor(cursor_x * scale) + 0.5f;
            vertices[3][1] = (float) fb_height + 0.5f;

            glBufferData(GL_ARRAY_BUFFER,
                         sizeof(vertices),
                         vertices,
                         GL_STREAM_DRAW);

            mat4x4_ortho(mvp, 0.f, (float) fb_width, 0.f, (float) fb_height, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);

            glDrawArrays(GL_LINES, 0, 4);
        }

        glfwSwapBuffers(window);

        if (animate_cursor)
        {
            const int i = (int) (glfwGetTime() * 30.0) % CURSOR_FRAME_COUNT;
            if (current_frame != star_cursors[i])
            {
                glfwSetCursor(window, star_cursors[i]);
                current_frame = star_cursors[i];
            }
        }
        else
            current_frame = NULL;

        if (wait_events)
        {
            if (animate_cursor)
                glfwWaitEventsTimeout(1.0 / 30.0);
            else
                glfwWaitEvents();
        }
        else
            glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwDestroyWindow(window);

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
        glfwDestroyCursor(star_cursors[i]);

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
        glfwDestroyCursor(standard_cursors[i]);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}